

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

bool google::ReadFlagsFromString(string *flagfilecontents,char *param_2,bool errors_are_fatal)

{
  bool bVar1;
  undefined1 uVar2;
  FlagRegistry *pFVar3;
  FlagSaverImpl saved_states;
  string local_a8;
  CommandLineFlagParser parser;
  
  pFVar3 = anon_unknown_1::FlagRegistry::GlobalRegistry();
  saved_states.backup_registry_.
  super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  saved_states.backup_registry_.
  super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  saved_states.backup_registry_.
  super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  saved_states.main_registry_ = pFVar3;
  FlagSaverImpl::SaveFromRegistry(&saved_states);
  parser.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &parser.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header;
  parser.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  parser.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  parser.error_flags_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header;
  parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parser.registry_ = pFVar3;
  parser.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       parser.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  gflags_mutex_namespace::Mutex::Lock(&pFVar3->lock_);
  anon_unknown_1::CommandLineFlagParser::ProcessOptionsFromStringLocked
            (&local_a8,&parser,flagfilecontents,SET_FLAGS_VALUE);
  std::__cxx11::string::~string((string *)&local_a8);
  gflags_mutex_namespace::Mutex::Unlock(&pFVar3->lock_);
  HandleCommandLineHelpFlags();
  bVar1 = anon_unknown_1::CommandLineFlagParser::ReportErrors(&parser);
  if (bVar1) {
    if (errors_are_fatal) {
      uVar2 = (*(code *)gflags_exitfunc)(1);
      return (bool)uVar2;
    }
    FlagSaverImpl::RestoreToRegistry(&saved_states);
  }
  anon_unknown_1::CommandLineFlagParser::~CommandLineFlagParser(&parser);
  FlagSaverImpl::~FlagSaverImpl(&saved_states);
  return !bVar1;
}

Assistant:

bool ReadFlagsFromString(const string& flagfilecontents,
                         const char* /*prog_name*/,  // TODO(csilvers): nix this
                         bool errors_are_fatal) {
  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  FlagSaverImpl saved_states(registry);
  saved_states.SaveFromRegistry();

  CommandLineFlagParser parser(registry);
  registry->Lock();
  parser.ProcessOptionsFromStringLocked(flagfilecontents, SET_FLAGS_VALUE);
  registry->Unlock();
  // Should we handle --help and such when reading flags from a string?  Sure.
  HandleCommandLineHelpFlags();
  if (parser.ReportErrors()) {
    // Error.  Restore all global flags to their previous values.
    if (errors_are_fatal)
      gflags_exitfunc(1);
    saved_states.RestoreToRegistry();
    return false;
  }
  return true;
}